

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  int iVar9;
  pointer pMVar10;
  void *__src;
  void *__dest;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  Mat m;
  Mat local_388;
  Mat local_338;
  pointer local_2e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2e0;
  Mat m_3;
  Mat m_7;
  Mat m_2;
  Mat m_1;
  Mat m_6;
  Mat m_5;
  Mat m_4;
  Mat m_11;
  Mat m_10;
  
  pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _h = pMVar10->h;
  iVar1 = this->direction;
  local_338.cstep = 0;
  local_338.data = (void *)0x0;
  local_338.refcount._0_4_ = 0;
  local_338.refcount._4_4_ = 0;
  local_338.elemsize._0_4_ = 0;
  local_338.elemsize._4_4_ = 0;
  local_338.elempack = 0;
  local_338.allocator = (Allocator *)0x0;
  local_338.dims = 0;
  local_338.w = 0;
  local_338.h = 0;
  local_338.d = 0;
  local_338.c = 0;
  local_388.cstep = 0;
  local_388.data = (void *)0x0;
  local_388.refcount._0_4_ = 0;
  local_388.refcount._4_4_ = 0;
  local_388.elemsize._0_4_ = 0;
  local_388.elemsize._4_4_ = 0;
  local_388.elempack = 0;
  local_388.allocator = (Allocator *)0x0;
  local_388.dims = 0;
  local_388.w = 0;
  local_388.h = 0;
  local_388.d = 0;
  local_388.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  iVar5 = -100;
  local_2e8 = pMVar10;
  local_2e0 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar10 == 0xd8) {
    Mat::clone(&m,(__fn *)(pMVar10 + 1),_allocator,0xd8,pMVar10);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_338.allocator == (Allocator *)0x0) {
          free(local_338.data);
        }
        else {
          (*(local_338.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_338.data = m.data;
    local_338.refcount._0_4_ = m.refcount._0_4_;
    local_338.refcount._4_4_ = m.refcount._4_4_;
    local_338.elemsize._0_4_ = (undefined4)m.elemsize;
    local_338.elemsize._4_4_ = m.elemsize._4_4_;
    local_338.elempack = m.elempack;
    local_338.allocator = m.allocator;
    local_338.dims = m.dims;
    local_338.w = m.w;
    local_338.h = m.h;
    uVar3._0_4_ = m.d;
    uVar3._4_4_ = m.c;
    local_338.d = m.d;
    local_338.c = m.c;
    local_338.cstep = m.cstep;
    sVar8 = m.cstep;
    uVar4 = uVar3;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      uVar4 = local_338._52_8_;
      if (*piVar2 == 0) {
        local_338._52_8_ = uVar3;
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
          uVar4 = local_338._52_8_;
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
          uVar4 = local_338._52_8_;
        }
      }
    }
    local_338._52_8_ = uVar4;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar8,
               pMVar10);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_388.allocator == (Allocator *)0x0) {
          free(local_388.data);
        }
        else {
          (*(local_388.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_388.data = m.data;
    local_388.refcount._0_4_ = m.refcount._0_4_;
    local_388.refcount._4_4_ = m.refcount._4_4_;
    local_388.elemsize._0_4_ = (undefined4)m.elemsize;
    local_388.elemsize._4_4_ = m.elemsize._4_4_;
    local_388.elempack = m.elempack;
    local_388.allocator = m.allocator;
    local_388.dims = m.dims;
    local_388.w = m.w;
    local_388.h = m.h;
    local_388.d = m.d;
    local_388.c = m.c;
    local_388.cstep = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    iVar9 = (iVar1 == 2) + 1;
    Mat::create(&local_338,this->num_output,iVar9,4,_allocator);
    if ((local_338.data == (void *)0x0) || (local_338.cstep * (long)local_338.c == 0))
    goto LAB_0032c4f6;
    uVar6 = (int)local_338.cstep * local_338.c;
    uVar11 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar11;
    }
    for (; (int)uVar7 != (int)uVar11; uVar11 = uVar11 + 1) {
      *(undefined4 *)((long)local_338.data + uVar11 * 4) = 0;
    }
    Mat::create(&local_388,this->hidden_size,iVar9,4,_allocator);
    if ((local_388.data == (void *)0x0) || (local_388.cstep * (long)local_388.c == 0))
    goto LAB_0032c4f6;
    uVar6 = (int)local_388.cstep * local_388.c;
    uVar11 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar11;
    }
    for (; (int)uVar7 != (int)uVar11; uVar11 = uVar11 + 1) {
      *(undefined4 *)((long)local_388.data + uVar11 * 4) = 0;
    }
  }
  this_00 = (local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    uVar6 = this->direction;
    if (uVar6 < 2) {
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.data = (this->weight_xc_data).data;
      uVar7 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar7;
      m.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m.c = (this->weight_xc_data).d;
      m.d = 1;
      iVar1 = (this->weight_xc_data).dims;
      m.dims = iVar1 + -1;
      m.cstep = (uVar7 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar1 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.data = (this->bias_c_data).data;
      uVar7 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar7;
      m_1.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
      m_1.c = (this->bias_c_data).d;
      m_1.d = 1;
      iVar1 = (this->bias_c_data).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar7 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar7;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = (this->weight_hc_data).d;
      m_2.data = (this->weight_hc_data).data;
      m_2.elemsize = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar8 = (long)m_2.h * (long)m_2.w;
      iVar1 = (this->weight_hc_data).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (m_2.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar1 == 4) {
        m_2.cstep = sVar8;
      }
      if (this->num_output == this->hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->weight_hr_data).w;
        m_3.h = (this->weight_hr_data).h;
        m_3.c = (this->weight_hr_data).d;
        m_3.data = (this->weight_hr_data).data;
        uVar7 = (this->weight_hr_data).elemsize;
        m_3.elempack = (this->weight_hr_data).elempack;
        m_3.allocator = (this->weight_hr_data).allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar7;
        m_3.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
        m_3.d = 1;
        iVar1 = (this->weight_hr_data).dims;
        m_3.dims = iVar1 + -1;
        m_3.cstep = (uVar7 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar7;
        if (iVar1 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar5 = lstm(local_2e8,this_00,uVar6,&m,&m_1,&m_2,&m_3,&local_338,&local_388,opt);
      if (iVar5 != 0) goto LAB_0032c4f6;
      uVar6 = this->direction;
    }
    if (uVar6 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
      iVar5 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar13 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
        pMVar10 = local_2e8;
        iVar5 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar13 = false;
        }
        else {
          m_2.cstep = (size_t)local_338.w;
          m_2.elemsize = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
          m_2.data = local_338.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_338.elempack;
          m_2.allocator = local_338.allocator;
          iVar12 = 2;
          m_2.w = local_338.w;
          m_2.h = 1;
          m_2.d = 1;
          iVar9 = 1;
          m_3.cstep = (size_t)local_388.w;
          m_3.data = local_388.data;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_388.elemsize;
          m_3.elemsize._4_4_ = local_388.elemsize._4_4_;
          m_3.elempack = local_388.elempack;
          m_3.allocator = local_388.allocator;
          m_3.w = local_388.w;
          m_3.h = 1;
          m_3.d = 1;
          m_4.w = (this->weight_xc_data).w;
          m_4.h = (this->weight_xc_data).h;
          m_4.c = (this->weight_xc_data).d;
          m_4.data = (this->weight_xc_data).data;
          m_4.elemsize = (this->weight_xc_data).elemsize;
          m_4.elempack = (this->weight_xc_data).elempack;
          m_4.allocator = (this->weight_xc_data).allocator;
          m_4.refcount = (int *)0x0;
          m_4.d = 1;
          sVar8 = (long)m_4.h * (long)m_4.w;
          iVar1 = (this->weight_xc_data).dims;
          m_4.dims = iVar1 + -1;
          m_4.cstep = (m_4.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_4.elemsize;
          if (iVar1 == 4) {
            m_4.cstep = sVar8;
          }
          m_5.w = (this->bias_c_data).w;
          m_5.h = (this->bias_c_data).h;
          m_5.c = (this->bias_c_data).d;
          m_5.data = (this->bias_c_data).data;
          m_5.elemsize = (this->bias_c_data).elemsize;
          m_5.elempack = (this->bias_c_data).elempack;
          m_5.allocator = (this->bias_c_data).allocator;
          m_5.refcount = (int *)0x0;
          m_5.d = 1;
          sVar8 = (long)m_5.h * (long)m_5.w;
          iVar1 = (this->bias_c_data).dims;
          m_5.dims = iVar1 + -1;
          m_5.cstep = (m_5.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_5.elemsize;
          if (iVar1 == 4) {
            m_5.cstep = sVar8;
          }
          m_6.w = (this->weight_hc_data).w;
          m_6.h = (this->weight_hc_data).h;
          m_6.c = (this->weight_hc_data).d;
          m_6.data = (this->weight_hc_data).data;
          m_6.elemsize = (this->weight_hc_data).elemsize;
          m_6.elempack = (this->weight_hc_data).elempack;
          m_6.allocator = (this->weight_hc_data).allocator;
          m_6.refcount = (int *)0x0;
          m_6.d = 1;
          iVar1 = (this->weight_hc_data).dims;
          m_6.dims = iVar1 + -1;
          m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                      m_6.elemsize;
          if (iVar1 == 4) {
            m_6.cstep = (long)m_6.h * (long)m_6.w;
          }
          if (this->num_output == this->hidden_size) {
            m_7.cstep = 0;
            m_7.data = (void *)0x0;
            m_7.elemsize._0_4_ = 0;
            m_7.elemsize._4_4_ = 0;
            m_7.elempack = 0;
            m_7.allocator = (Allocator *)0x0;
            m_7.dims = 0;
            m_7.w = 0;
            m_7.h = 0;
            m_7.d = 0;
            m_7.c = 0;
          }
          else {
            m_7.w = (this->weight_hr_data).w;
            m_7.h = (this->weight_hr_data).h;
            m_7.data = (this->weight_hr_data).data;
            uVar7 = (this->weight_hr_data).elemsize;
            m_7.elempack = (this->weight_hr_data).elempack;
            m_7.allocator = (this->weight_hr_data).allocator;
            m_7.elemsize._0_4_ = (undefined4)uVar7;
            m_7.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_7.c = (this->weight_hr_data).d;
            m_7.d = 1;
            iVar1 = (this->weight_hr_data).dims;
            m_7.dims = iVar1 + -1;
            m_7.cstep = (uVar7 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar1 == 4) {
              m_7.cstep = (long)m_7.h * (long)m_7.w;
            }
          }
          m_7.refcount._4_4_ = 0;
          m_7.refcount._0_4_ = 0;
          m_3.dims = iVar12;
          m_3.c = iVar9;
          m_2.dims = iVar12;
          m_2.c = iVar9;
          iVar5 = lstm(local_2e8,&m,0,&m_4,&m_5,&m_6,&m_7,&m_2,&m_3,opt);
          if (iVar5 == 0) {
            m_4.cstep = (size_t)local_338.w;
            m_4.elemsize = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
            m_4.data = (void *)(m_4.elemsize * m_4.cstep + (long)local_338.data);
            m_4.refcount = (int *)0x0;
            m_4.elempack = local_338.elempack;
            m_4.allocator = local_338.allocator;
            m_4.w = local_338.w;
            m_4.h = 1;
            m_4.d = 1;
            m_5.cstep = (size_t)local_388.w;
            m_5.elemsize = CONCAT44(local_388.elemsize._4_4_,(undefined4)local_388.elemsize);
            m_5.data = (void *)(m_5.elemsize * m_5.cstep + (long)local_388.data);
            m_5.refcount = (int *)0x0;
            m_5.elempack = local_388.elempack;
            m_5.allocator = local_388.allocator;
            m_5.w = local_388.w;
            m_5.h = 1;
            m_5.d = 1;
            m_6.w = (this->weight_xc_data).w;
            m_6.h = (this->weight_xc_data).h;
            m_6.elemsize = (this->weight_xc_data).elemsize;
            m_6.data = (void *)((this->weight_xc_data).cstep * m_6.elemsize +
                               (long)(this->weight_xc_data).data);
            m_6.c = (this->weight_xc_data).d;
            m_6.elempack = (this->weight_xc_data).elempack;
            m_6.allocator = (this->weight_xc_data).allocator;
            m_6.refcount = (int *)0x0;
            iVar1 = (this->weight_xc_data).dims;
            m_6.dims = iVar1 + -1;
            m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                        m_6.elemsize;
            if (iVar1 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
            m_7.w = (this->bias_c_data).w;
            m_7.h = (this->bias_c_data).h;
            uVar7 = (this->bias_c_data).elemsize;
            m_7.data = (void *)((this->bias_c_data).cstep * uVar7 + (long)(this->bias_c_data).data);
            m_7.elempack = (this->bias_c_data).elempack;
            m_7.allocator = (this->bias_c_data).allocator;
            m_7.refcount._0_4_ = 0;
            m_7.refcount._4_4_ = 0;
            m_7.elemsize._0_4_ = (undefined4)uVar7;
            m_7.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
            m_7.c = (this->bias_c_data).d;
            m_7.d = 1;
            iVar1 = (this->bias_c_data).dims;
            m_7.dims = iVar1 + -1;
            m_7.cstep = (uVar7 * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) / uVar7;
            if (iVar1 == 4) {
              m_7.cstep = (long)m_7.h * (long)m_7.w;
            }
            m_10.w = (this->weight_hc_data).w;
            m_10.h = (this->weight_hc_data).h;
            m_10.elemsize = (this->weight_hc_data).elemsize;
            m_10.data = (void *)((this->weight_hc_data).cstep * m_10.elemsize +
                                (long)(this->weight_hc_data).data);
            m_10.c = (this->weight_hc_data).d;
            m_10.elempack = (this->weight_hc_data).elempack;
            m_10.allocator = (this->weight_hc_data).allocator;
            m_10.refcount = (int *)0x0;
            m_10.d = 1;
            iVar1 = (this->weight_hc_data).dims;
            m_10.dims = iVar1 + -1;
            m_10.cstep = (m_10.elemsize * (long)m_10.h * (long)m_10.w + 0xf & 0xfffffffffffffff0) /
                         m_10.elemsize;
            if (iVar1 == 4) {
              m_10.cstep = (long)m_10.h * (long)m_10.w;
            }
            if (this->num_output == this->hidden_size) {
              m_11.cstep = 0;
              m_11.data = (void *)0x0;
              m_11.elemsize._0_4_ = 0;
              m_11.elemsize._4_4_ = 0;
              m_11.elempack = 0;
              m_11.allocator = (Allocator *)0x0;
              m_11.dims = 0;
              m_11.w = 0;
              m_11.h = 0;
              m_11.d = 0;
              m_11.c = 0;
            }
            else {
              m_11.w = (this->weight_hr_data).w;
              m_11.h = (this->weight_hr_data).h;
              uVar7 = (this->weight_hr_data).elemsize;
              m_11.data = (void *)((this->weight_hr_data).cstep * uVar7 +
                                  (long)(this->weight_hr_data).data);
              m_11.elempack = (this->weight_hr_data).elempack;
              m_11.allocator = (this->weight_hr_data).allocator;
              m_11.elemsize._0_4_ = (undefined4)uVar7;
              m_11.elemsize._4_4_ = (undefined4)(uVar7 >> 0x20);
              m_11.c = (this->weight_hr_data).d;
              m_11.d = 1;
              iVar1 = (this->weight_hr_data).dims;
              m_11.dims = iVar1 + -1;
              m_11.cstep = (uVar7 * (long)m_11.h * (long)m_11.w + 0xf & 0xfffffffffffffff0) / uVar7;
              if (iVar1 == 4) {
                m_11.cstep = (long)m_11.h * (long)m_11.w;
              }
            }
            m_11.refcount._4_4_ = 0;
            m_11.refcount._0_4_ = 0;
            m_6.d = iVar9;
            m_5.dims = iVar12;
            m_5.c = iVar9;
            m_4.dims = iVar12;
            m_4.c = iVar9;
            iVar5 = lstm(pMVar10,&m_1,1,&m_6,&m_7,&m_10,&m_11,&m_4,&m_5,opt);
            bVar13 = iVar5 == 0;
            if (bVar13) {
              uVar7 = (ulong)_h;
              if ((int)_h < 1) {
                uVar7 = 0;
              }
              for (uVar11 = 0; iVar5 = 0, uVar7 != uVar11; uVar11 = uVar11 + 1) {
                __src = (void *)((long)m_1.w * uVar11 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar11 * this_00->elemsize +
                                 (long)this_00->data);
                memcpy(__dest,(void *)((long)m.w * uVar11 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)this->num_output << 2);
                memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                       (long)this->num_output << 2);
              }
            }
            piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  free(m_3.data);
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar13 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                free(m_2.data);
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar13) goto LAB_0032c4f6;
    }
    pMVar10 = (local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar5 = 0;
    if ((long)(local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar10 == 0xd8) {
      if (pMVar10 + 1 != &local_338) {
        piVar2 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar10[1].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar10[1].allocator == (Allocator *)0x0) {
              free(pMVar10[1].data);
            }
            else {
              (*(pMVar10[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar10[1].data = local_338.data;
        pMVar10[1].refcount = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
        pMVar10[1].elemsize = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
        pMVar10[1].elempack = local_338.elempack;
        pMVar10[1].allocator = local_338.allocator;
        pMVar10[1].dims = local_338.dims;
        pMVar10[1].w = local_338.w;
        pMVar10[1].h = local_338.h;
        pMVar10[1].d = local_338.d;
        pMVar10[1].c = local_338.c;
        pMVar10[1].cstep = local_338.cstep;
        pMVar10 = (local_2e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      if (pMVar10 + 2 != &local_388) {
        piVar2 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar10[2].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar10[2].allocator == (Allocator *)0x0) {
              free(pMVar10[2].data);
            }
            else {
              (*(pMVar10[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar10[2].data = local_388.data;
        pMVar10[2].refcount = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
        pMVar10[2].elemsize = CONCAT44(local_388.elemsize._4_4_,(undefined4)local_388.elemsize);
        pMVar10[2].elempack = local_388.elempack;
        pMVar10[2].allocator = local_388.allocator;
        pMVar10[2].dims = local_388.dims;
        pMVar10[2].w = local_388.w;
        pMVar10[2].h = local_388.h;
        pMVar10[2].d = local_388.d;
        pMVar10[2].c = local_388.c;
        pMVar10[2].cstep = local_388.cstep;
      }
    }
  }
LAB_0032c4f6:
  piVar2 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_388.allocator == (Allocator *)0x0) {
        free(local_388.data);
      }
      else {
        (*(local_388.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_338.allocator == (Allocator *)0x0) {
        free(local_338.data);
      }
      else {
        (*(local_338.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}